

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Dictionary.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDFObjectHandle::removeKeyAndGetOld(QPDFObjectHandle *this,string *key)

{
  bool bVar1;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar2;
  BaseDictionary local_58 [2];
  undefined1 local_38 [8];
  Dictionary dict;
  string *key_local;
  QPDFObjectHandle *this_local;
  QPDFObjectHandle *result;
  
  dict.super_BaseDictionary.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  newNull();
  as_dictionary((QPDFObjectHandle *)local_38,(typed)key);
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_38);
  if (bVar1) {
    ::qpdf::BaseDictionary::getKey(local_58,(string *)local_38);
    operator=(this,(QPDFObjectHandle *)local_58);
    ~QPDFObjectHandle((QPDFObjectHandle *)local_58);
  }
  ::qpdf::Dictionary::~Dictionary((Dictionary *)local_38);
  removeKey((QPDFObjectHandle *)key,in_RDX);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::removeKeyAndGetOld(std::string const& key)
{
    auto result = QPDFObjectHandle::newNull();
    if (auto dict = as_dictionary(strict)) {
        result = dict.getKey(key);
    }
    removeKey(key);
    return result;
}